

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forwardDilation
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,conv_func conv,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  code *in_RCX;
  long lVar5;
  Mat *in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  int j_1;
  float *ptr_1;
  int i_1;
  float *outptr_1;
  int c_1;
  Option opt_g;
  int j;
  float *ptr;
  int i;
  float *outptr;
  int c;
  int inner_outh;
  int inner_outw;
  int inner_h;
  int inner_w;
  int y;
  int x;
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  int outh;
  int outw;
  int hpad;
  int wpad;
  Mat bottom_blob_bordered;
  int kernel_extent;
  int dilation;
  int stride;
  int kernel_size;
  size_t elemsize;
  int h;
  int w;
  Mat *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  float *in_stack_fffffffffffffd30;
  float *in_stack_fffffffffffffd38;
  Mat *in_stack_fffffffffffffd40;
  int local_27c;
  Mat local_278;
  float *local_240;
  int local_234;
  Mat local_230;
  Mat *local_1f8;
  int local_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  Allocator *pAStack_1e0;
  undefined8 local_1d8;
  int local_1c4;
  Mat local_1c0;
  float *local_188;
  int local_17c;
  Mat local_178;
  float *local_140;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  Mat local_118;
  Mat local_e0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  undefined4 local_98;
  Mat local_88;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  size_t local_40;
  int local_38;
  int local_34;
  undefined4 *local_30;
  code *local_28;
  Mat *local_18;
  int local_4;
  
  local_34 = in_RSI->w;
  local_38 = in_RSI->h;
  local_40 = in_RSI->elemsize;
  local_44 = *(int *)(in_RDI + 0x84);
  local_48 = *(int *)(in_RDI + 0x94);
  local_4c = *(int *)(in_RDI + 0x8c);
  local_50 = local_4c * (local_44 + -1) + 1;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  Mat::Mat(&local_88,in_RSI);
  if ((*(int *)(in_RDI + 0x9c) < 1) && (*(int *)(in_RDI + 0xa0) < 1)) {
    if ((*(int *)(in_RDI + 0x9c) == -0xe9) && (*(int *)(in_RDI + 0xa0) == -0xe9)) {
      local_9c = (local_50 + ((local_34 + -1) / local_48) * local_48) - local_34;
      local_a0 = (local_50 + ((local_38 + -1) / local_48) * local_48) - local_38;
      if ((0 < local_9c) || (0 < local_a0)) {
        in_stack_fffffffffffffd20 = *(Mat **)(local_30 + 4);
        in_stack_fffffffffffffd28 = local_30[1];
        copy_make_border((Mat *)bottom_blob_bordered.cstep,(Mat *)bottom_blob_bordered._40_8_,
                         bottom_blob_bordered.w,bottom_blob_bordered.dims,
                         bottom_blob_bordered.allocator._4_4_,(int)bottom_blob_bordered.allocator,
                         stride,bottom_blob_bordered.elemsize._4_4_,(Allocator *)elemsize,h);
        bVar1 = Mat::empty(in_stack_fffffffffffffd20);
        if (bVar1) {
          local_4 = -100;
          local_98 = 1;
          goto LAB_00113382;
        }
      }
      local_34 = local_88.w;
      local_38 = local_88.h;
    }
  }
  else {
    in_stack_fffffffffffffd20 = *(Mat **)(local_30 + 4);
    in_stack_fffffffffffffd28 = local_30[1];
    copy_make_border((Mat *)bottom_blob_bordered.cstep,(Mat *)bottom_blob_bordered._40_8_,
                     bottom_blob_bordered.w,bottom_blob_bordered.dims,
                     bottom_blob_bordered.allocator._4_4_,(int)bottom_blob_bordered.allocator,stride
                     ,bottom_blob_bordered.elemsize._4_4_,(Allocator *)elemsize,h);
    bVar1 = Mat::empty(in_stack_fffffffffffffd20);
    if (bVar1) {
      local_4 = -100;
      local_98 = 1;
      goto LAB_00113382;
    }
    local_34 = local_88.w;
    local_38 = local_88.h;
  }
  local_a4 = (local_34 - local_50) / local_48 + 1;
  local_a8 = (local_38 - local_50) / local_48 + 1;
  Mat::create(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
              (int)in_stack_fffffffffffffd38,(int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
              CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
              (Allocator *)in_stack_fffffffffffffd20);
  bVar1 = Mat::empty(in_stack_fffffffffffffd20);
  if (bVar1) {
    local_4 = -100;
    local_98 = 1;
  }
  else {
    Mat::Mat(&local_e0);
    Mat::Mat(&local_118);
    for (local_11c = 0; local_11c < local_4c; local_11c = local_11c + 1) {
      for (local_120 = 0; local_120 < local_4c; local_120 = local_120 + 1) {
        local_124 = ((local_34 - local_120) + -1 + local_4c) / local_4c;
        local_128 = ((local_38 - local_11c) + -1 + local_4c) / local_4c;
        local_12c = (local_124 - local_44) / local_48 + 1;
        local_130 = (local_128 - local_44) / local_48 + 1;
        Mat::create(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                    (int)in_stack_fffffffffffffd38,(int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                    CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                    (Allocator *)in_stack_fffffffffffffd20);
        bVar1 = Mat::empty(in_stack_fffffffffffffd20);
        if (bVar1) {
          local_4 = -100;
          goto LAB_0011334a;
        }
        Mat::create(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                    (int)in_stack_fffffffffffffd38,(int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                    CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                    (Allocator *)in_stack_fffffffffffffd20);
        bVar1 = Mat::empty(in_stack_fffffffffffffd20);
        if (bVar1) {
          local_4 = -100;
          goto LAB_0011334a;
        }
        for (local_134 = 0; local_134 < local_18->c; local_134 = local_134 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                       (int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_178);
          Mat::~Mat((Mat *)0x112eb5);
          local_140 = pfVar2;
          for (local_17c = 0; local_17c < local_128; local_17c = local_17c + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                         (int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_1c0);
            iVar3 = local_4c * local_17c * local_34;
            iVar4 = local_11c * local_34;
            lVar5 = (long)local_120;
            Mat::~Mat((Mat *)0x112f73);
            for (local_1c4 = 0; local_1c4 < local_124; local_1c4 = local_1c4 + 1) {
              local_140[local_1c4] = (pfVar2 + (long)iVar3 + iVar4 + lVar5)[local_1c4 * local_4c];
            }
            local_140 = local_140 + local_124;
            local_188 = pfVar2 + (long)iVar3 + iVar4 + lVar5;
          }
        }
        local_1d8 = *(undefined8 *)(local_30 + 4);
        local_1e8 = *local_30;
        uStack_1e4 = local_30[1];
        pAStack_1e0 = local_118.allocator;
        (*local_28)(&local_e0,&local_118,in_RDI + 0xb0,in_RDI + 0xe8,&local_1e8);
        for (local_1ec = 0; local_1ec < *(int *)(in_RDI + 0x80); local_1ec = local_1ec + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                       (int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_230);
          in_stack_fffffffffffffd40 =
               (Mat *)(pfVar2 + (long)(local_11c * local_a4) + (long)local_120);
          Mat::~Mat((Mat *)0x11317e);
          local_1f8 = in_stack_fffffffffffffd40;
          for (local_234 = 0; local_234 < local_130; local_234 = local_234 + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                         (int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
            in_stack_fffffffffffffd38 = Mat::operator_cast_to_float_(&local_278);
            in_stack_fffffffffffffd30 = in_stack_fffffffffffffd38 + local_234 * local_12c;
            Mat::~Mat((Mat *)0x113203);
            for (local_27c = 0; local_27c < local_12c; local_27c = local_27c + 1) {
              *(float *)((long)&local_1f8->data + (long)(local_27c * local_4c) * 4) =
                   in_stack_fffffffffffffd30[local_27c];
            }
            local_1f8 = (Mat *)((long)&local_1f8->data + (long)(local_4c * local_a4) * 4);
            local_240 = in_stack_fffffffffffffd30;
          }
        }
      }
    }
    local_4 = 0;
LAB_0011334a:
    local_98 = 1;
    Mat::~Mat((Mat *)0x113357);
    Mat::~Mat((Mat *)0x113364);
  }
LAB_00113382:
  Mat::~Mat((Mat *)0x11338f);
  return local_4;
}

Assistant:

int Convolution_x86::forwardDilation(const Mat& bottom_blob, Mat& top_blob, conv_func conv, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob_bordered.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            conv(inner_bottom_blob, inner_top_blob, weight_data, bias_data, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    return 0;
}